

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreUtil.cpp
# Opt level: O0

VkImageCreateInfo *
vkt::image::makeImageCreateInfo
          (VkImageCreateInfo *__return_storage_ptr__,Texture *texture,VkFormat format,
          VkImageUsageFlags usage,VkImageCreateFlags flags)

{
  bool bVar1;
  ImageType imageType;
  VkImageType VVar2;
  deUint32 dVar3;
  VkExtent3D VVar4;
  VkImageCreateInfo *imageParams;
  undefined8 local_40;
  deUint32 local_38;
  VkSampleCountFlagBits local_20;
  VkImageCreateFlags local_1c;
  VkSampleCountFlagBits samples;
  VkImageCreateFlags flags_local;
  VkImageUsageFlags usage_local;
  VkFormat format_local;
  Texture *texture_local;
  
  local_1c = flags;
  samples = usage;
  flags_local = format;
  _usage_local = texture;
  local_20 = Texture::numSamples(texture);
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  bVar1 = isCube(_usage_local);
  __return_storage_ptr__->flags = (uint)bVar1 << 4 | local_1c;
  imageType = Texture::type(_usage_local);
  VVar2 = mapImageType(imageType);
  __return_storage_ptr__->imageType = VVar2;
  __return_storage_ptr__->format = flags_local;
  Texture::layerSize((Texture *)&stack0xffffffffffffffd4);
  VVar4 = ::vk::makeExtent3D((IVec3 *)&stack0xffffffffffffffd4);
  local_40 = VVar4._0_8_;
  (__return_storage_ptr__->extent).width = (undefined4)local_40;
  (__return_storage_ptr__->extent).height = local_40._4_4_;
  local_38 = VVar4.depth;
  (__return_storage_ptr__->extent).depth = local_38;
  __return_storage_ptr__->mipLevels = 1;
  dVar3 = Texture::numLayers(_usage_local);
  __return_storage_ptr__->arrayLayers = dVar3;
  __return_storage_ptr__->samples = local_20;
  __return_storage_ptr__->tiling = VK_IMAGE_TILING_OPTIMAL;
  __return_storage_ptr__->usage = samples;
  __return_storage_ptr__->sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  __return_storage_ptr__->queueFamilyIndexCount = 0;
  __return_storage_ptr__->pQueueFamilyIndices = (deUint32 *)0x0;
  __return_storage_ptr__->initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  return __return_storage_ptr__;
}

Assistant:

VkImageCreateInfo makeImageCreateInfo (const Texture& texture, const VkFormat format, const VkImageUsageFlags usage, const VkImageCreateFlags flags)
{
	const VkSampleCountFlagBits samples = static_cast<VkSampleCountFlagBits>(texture.numSamples());	// integer and bit mask are aligned, so we can cast like this

	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,														// VkStructureType			sType;
		DE_NULL,																					// const void*				pNext;
		(isCube(texture) ? (VkImageCreateFlags)VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0u) | flags,	// VkImageCreateFlags		flags;
		mapImageType(texture.type()),																// VkImageType				imageType;
		format,																						// VkFormat					format;
		makeExtent3D(texture.layerSize()),															// VkExtent3D				extent;
		1u,																							// deUint32					mipLevels;
		(deUint32)texture.numLayers(),																// deUint32					arrayLayers;
		samples,																					// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,																	// VkImageTiling			tiling;
		usage,																						// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,																	// VkSharingMode			sharingMode;
		0u,																							// deUint32					queueFamilyIndexCount;
		DE_NULL,																					// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,																	// VkImageLayout			initialLayout;
	};
	return imageParams;
}